

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_errno run_server_state_machine(pcp_server_t *s,pcp_event_e event)

{
  pcp_server_state_e pVar1;
  ulong uVar2;
  pcp_server_state_machine_t *state_def;
  uint i;
  pcp_event_e event_local;
  pcp_server_t *s_local;
  
  if (s == (pcp_server_t *)0x0) {
    s_local._4_4_ = PCP_ERR_BAD_ARGS;
  }
  else {
    for (state_def._0_4_ = 0; (uint)state_def < 0xf; state_def._0_4_ = (uint)state_def + 1) {
      uVar2 = (ulong)(uint)state_def;
      if (((server_sm[uVar2].state == s->server_state) || (server_sm[uVar2].state == pss_any)) &&
         ((server_sm[uVar2].event == pcpe_any || (server_sm[uVar2].event == event)))) {
        pVar1 = (*server_sm[uVar2].handler)(s);
        s->server_state = pVar1;
        break;
      }
    }
    s_local._4_4_ = PCP_ERR_SUCCESS;
  }
  return s_local._4_4_;
}

Assistant:

pcp_errno run_server_state_machine(pcp_server_t *s, pcp_event_e event) {
    unsigned i;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);
    if (!s) {
        return PCP_ERR_BAD_ARGS;
    }

    for (i = 0; i < SERVER_STATE_MACHINE_COUNT; ++i) {
        pcp_server_state_machine_t *state_def = server_sm + i;
        if ((state_def->state == s->server_state) ||
            (state_def->state == pss_any)) {
            if ((state_def->event == pcpe_any) || (state_def->event == event)) {
                PCP_LOG_DEBUG("Executing server state handler %s\n    server "
                              "\t: %s (index %d)\n"
                              "    state\t: %s\n"
                              "    event\t: %s",
                              dbg_get_func_name(state_def->handler),
                              s->pcp_server_paddr, s->index,
                              dbg_get_sstate_name(s->server_state),
                              dbg_get_sevent_name(event));

                s->server_state = state_def->handler(s);

                PCP_LOG_DEBUG("Return from server state handler's %s \n    "
                              "result state: %s",
                              dbg_get_func_name(state_def->handler),
                              dbg_get_sstate_name(s->server_state));

                break;
            }
        }
    }
    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return PCP_ERR_SUCCESS;
}